

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O2

int tconcat(lua_State *L)

{
  int iVar1;
  char *s;
  ulong uVar2;
  lua_Integer lVar3;
  size_t sVar4;
  int i;
  size_t lsep;
  luaL_Buffer b;
  
  s = luaL_optlstring(L,2,"",&lsep);
  luaL_checktype(L,1,5);
  uVar2 = luaL_optinteger(L,3,1);
  iVar1 = lua_type(L,4);
  if (iVar1 < 1) {
    sVar4 = lua_objlen(L,1);
    iVar1 = (int)sVar4;
  }
  else {
    lVar3 = luaL_checkinteger(L,4);
    iVar1 = (int)lVar3;
  }
  luaL_buffinit(L,&b);
  while( true ) {
    i = (int)uVar2;
    if (iVar1 <= i) break;
    addfield(L,&b,i);
    luaL_addlstring(&b,s,lsep);
    uVar2 = (ulong)(i + 1);
  }
  if (i == iVar1) {
    addfield(L,&b,iVar1);
  }
  luaL_pushresult(&b);
  return 1;
}

Assistant:

static int tconcat (lua_State *L) {
  luaL_Buffer b;
  size_t lsep;
  int i, last;
  const char *sep = luaL_optlstring(L, 2, "", &lsep);
  luaL_checktype(L, 1, LUA_TTABLE);
  i = luaL_optint(L, 3, 1);
  last = luaL_opt(L, luaL_checkint, 4, luaL_getn(L, 1));
  luaL_buffinit(L, &b);
  for (; i < last; i++) {
    addfield(L, &b, i);
    luaL_addlstring(&b, sep, lsep);
  }
  if (i == last)  /* add last value (if interval was not empty) */
    addfield(L, &b, i);
  luaL_pushresult(&b);
  return 1;
}